

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

Emb_Obj_t * Emb_ManFindDistances(Emb_Man_t *p,Vec_Int_t *vStart,Emb_Dat_t *pDist)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Int_t *vNext;
  Emb_Obj_t *pEVar3;
  long lVar4;
  
  p->nReached = 0;
  p->nDistMax = 0;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p_00->pArray = piVar2;
  vNext = (Vec_Int_t *)malloc(0x10);
  vNext->nCap = 1000;
  vNext->nSize = 0;
  piVar2 = (int *)malloc(4000);
  vNext->pArray = piVar2;
  p->nTravIds = p->nTravIds + 1;
  if (0 < vStart->nSize) {
    lVar4 = 0;
    do {
      piVar2 = p->pObjData;
      if (piVar2 == (int *)0x0) break;
      uVar1 = vStart->pArray[lVar4];
      piVar2[(ulong)uVar1 + 3] = p->nTravIds;
      Vec_IntPush(p_00,piVar2[(ulong)uVar1 + 2]);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vStart->nSize);
  }
  pEVar3 = Emb_ManPerformBfs(p,p_00,vNext,pDist);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (vNext->pArray != (int *)0x0) {
    free(vNext->pArray);
  }
  free(vNext);
  return pEVar3;
}

Assistant:

Emb_Obj_t * Emb_ManFindDistances( Emb_Man_t * p, Vec_Int_t * vStart, Emb_Dat_t * pDist )
{
    Vec_Int_t * vThis, * vNext;
    Emb_Obj_t * pThis, * pResult;
    int i;
    p->nReached = p->nDistMax = 0;
    vThis = Vec_IntAlloc( 1000 );
    vNext = Vec_IntAlloc( 1000 );
    Emb_ManIncrementTravId( p );
    Emb_ManForEachObjVec( vStart, p, pThis, i )
    {
        Emb_ObjSetTravIdCurrent( p, pThis );
        Vec_IntPush( vThis, pThis->hHandle );
    }
    pResult = Emb_ManPerformBfs( p, vThis, vNext, pDist );
    Vec_IntFree( vThis );
    Vec_IntFree( vNext );
    return pResult;
}